

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O2

_Bool tval_is_armor(object *obj)

{
  return (byte)(obj->tval - 10) < 9;
}

Assistant:

bool tval_is_armor(const struct object *obj)
{
	switch (obj->tval) {
		case TV_DRAG_ARMOR:
		case TV_HARD_ARMOR:
		case TV_SOFT_ARMOR:
		case TV_SHIELD:
		case TV_CLOAK:
		case TV_CROWN:
		case TV_HELM:
		case TV_BOOTS:
		case TV_GLOVES:
			return true;
		default:
			return false;
	}
}